

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-util.c
# Opt level: O0

monster_race * lookup_monster(char *name)

{
  int iVar1;
  wchar_t wVar2;
  monster_race *pmVar3;
  char *pcVar4;
  monster_race *race;
  monster_race *closest;
  wchar_t i;
  char *name_local;
  
  race = (monster_race *)0x0;
  closest._4_4_ = 0;
  do {
    if ((int)(uint)z_info->r_max <= closest._4_4_) {
      return race;
    }
    pmVar3 = r_info + closest._4_4_;
    if (pmVar3->name != (char *)0x0) {
      iVar1 = strcmp(name,pmVar3->name);
      if (iVar1 == 0) {
        return pmVar3;
      }
      wVar2 = my_stricmp(name,pmVar3->name);
      if (wVar2 == L'\0') {
        race = pmVar3;
      }
      if ((race == (monster_race *)0x0) &&
         (pcVar4 = my_stristr(pmVar3->name,name), pcVar4 != (char *)0x0)) {
        race = pmVar3;
      }
    }
    closest._4_4_ = closest._4_4_ + 1;
  } while( true );
}

Assistant:

struct monster_race *lookup_monster(const char *name)
{
	int i;
	struct monster_race *closest = NULL;

	/* Look for it */
	for (i = 0; i < z_info->r_max; i++) {
		struct monster_race *race = &r_info[i];
		if (!race->name)
			continue;

		/* Test for equality */
		if (streq(name, race->name))
			return race;

		/* Test for near equality */
		if (my_stricmp(name, race->name) == 0)
			closest = race;

		/* Test for close matches */
		if (!closest && my_stristr(race->name, name))
			closest = race;
	}

	/* Return our best match */
	return closest;
}